

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O3

MethodBuilder * __thiscall
slang::ast::ClassBuilder::addMethod
          (MethodBuilder *__return_storage_ptr__,ClassBuilder *this,string_view name,Type *retType,
          SubroutineKind kind)

{
  Compilation *args;
  SubroutineSymbol *member;
  VariableLifetime local_30;
  SubroutineKind local_2c;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = name._M_str;
  local_28._M_len = name._M_len;
  args = this->compilation;
  __return_storage_ptr__->compilation = args;
  local_30 = Automatic;
  local_2c = kind;
  member = BumpAllocator::
           emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
                     (&args->super_BumpAllocator,args,&local_28,
                      (SourceLocation *)&SourceLocation::NoLocation,&local_30,&local_2c);
  __return_storage_ptr__->symbol = member;
  (__return_storage_ptr__->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.
  data_ = (pointer)(__return_storage_ptr__->args).
                   super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.firstElement;
  (__return_storage_ptr__->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len
       = 0;
  (__return_storage_ptr__->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.cap
       = 5;
  (member->declaredReturnType).type = retType;
  (member->flags).m_bits = 0x200;
  Scope::insertMember(&this->type->super_Scope,&member->super_Symbol,
                      (this->type->super_Scope).lastMember,false,true);
  return __return_storage_ptr__;
}

Assistant:

MethodBuilder ClassBuilder::addMethod(std::string_view name, const Type& retType,
                                      SubroutineKind kind) {
    MethodBuilder method(compilation, name, retType, kind);
    type.addMember(method.symbol);
    return method;
}